

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::ThrowingDestructor::~ThrowingDestructor(ThrowingDestructor *this)

{
  bool bVar1;
  Fault local_18;
  
  bVar1 = UnwindDetector::isUnwinding(&this->super_UnwindDetector);
  if (bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (&local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x5b,FAILED,(char *)0x0,"\"this is a test, not a real bug\"",
               (char (*) [31])"this is a test, not a real bug");
    Debug::Fault::fatal(&local_18);
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x5b,FAILED,(char *)0x0,"\"this is a test, not a real bug\"",
             (char (*) [31])"this is a test, not a real bug");
  Debug::Fault::fatal(&local_18);
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }